

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::addDecoration
          (Builder *this,Id id,Decoration decoration,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *literals)

{
  bool bVar1;
  Instruction *this_00;
  size_type sVar2;
  reference puVar3;
  value_type local_50;
  uint local_44;
  const_iterator cStack_40;
  uint literal;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  Instruction *dec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *literals_local;
  Decoration decoration_local;
  Id id_local;
  Builder *this_local;
  
  if (decoration != DecorationMax) {
    this_00 = (Instruction *)::operator_new(0x60);
    spv::Instruction::Instruction(this_00,OpDecorate);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(literals);
    spv::Instruction::reserveOperands(this_00,sVar2 + 2);
    spv::Instruction::addIdOperand(this_00,id);
    spv::Instruction::addImmediateOperand(this_00,decoration);
    __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(literals);
    cStack_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(literals);
    while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc0), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end1);
      local_44 = *puVar3;
      spv::Instruction::addImmediateOperand(this_00,local_44);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end1);
    }
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_50,
               this_00);
    std::
    set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::insert(&this->decorations,&local_50);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_50);
  }
  return;
}

Assistant:

void Builder::addDecoration(Id id, Decoration decoration, const std::vector<unsigned>& literals)
{
    if (decoration == spv::DecorationMax)
        return;

    Instruction* dec = new Instruction(OpDecorate);
    dec->reserveOperands(literals.size() + 2);
    dec->addIdOperand(id);
    dec->addImmediateOperand(decoration);
    for (auto literal : literals)
        dec->addImmediateOperand(literal);

    decorations.insert(std::unique_ptr<Instruction>(dec));
}